

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitileave.hpp
# Opt level: O2

ull_type bitmanip::detail::ileave_arr_impl<unsigned_int,0ul,1ul,2ul>(uint32_t *param_1)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  
  uVar1 = ileaveZeros_const<2u,2u>(*param_1);
  uVar2 = ileaveZeros_const<2u,1u>(param_1[1]);
  uVar3 = ileaveZeros_shift<2u>(param_1[2]);
  return uVar3 | uVar2 | uVar1;
}

Assistant:

[[nodiscard]] constexpr auto ileave_arr_impl(std::index_sequence<I...>, Uint args[]) noexcept -> ull_type
{
    constexpr std::size_t max = sizeof...(I) - 1;
    return (ileaveZeros_const<max, max - I>(args[I]) | ...);
}